

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specwriter.cpp
# Opt level: O3

bool __thiscall
apngasm::spec::SpecWriter::writeJSON(SpecWriter *this,string *filePath,string *imageDir)

{
  pointer pcVar1;
  ssize_t sVar2;
  size_t __n;
  undefined1 uVar3;
  __string_type __str;
  JSONSpecWriterImpl impl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  JSONSpecWriterImpl local_30;
  
  if (this->_pApngasm == (APNGAsm *)0x0) {
    uVar3 = 0;
  }
  else {
    priv::JSONSpecWriterImpl::JSONSpecWriterImpl(&local_30,this->_pApngasm,this->_pListener);
    pcVar1 = (imageDir->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + imageDir->_M_string_length);
    __n = 1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_70,local_70._M_string_length,0,1,'/');
    anon_unknown_0::createRelativeDir(&local_50,filePath,&local_70);
    sVar2 = priv::JSONSpecWriterImpl::write(&local_30,(int)filePath,&local_50,__n);
    uVar3 = (undefined1)sVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)uVar3;
}

Assistant:

bool SpecWriter::writeJSON(const std::string& filePath, const std::string& imageDir) const
    {
      if (!_pApngasm)
        return false;

      priv::JSONSpecWriterImpl impl(_pApngasm, _pListener);
      return impl.write(filePath, createRelativeDir(filePath, imageDir + separator));
    }